

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall
QGraphicsScenePrivate::grabMouse(QGraphicsScenePrivate *this,QGraphicsItem *item,bool implicit)

{
  long lVar1;
  long lVar2;
  QGraphicsItem **ppQVar3;
  QGraphicsItem *this_00;
  long lVar4;
  long in_RCX;
  long lVar5;
  long in_FS_OFFSET;
  QGraphicsItem *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (this->mouseGrabberItems).d.size;
  if (lVar2 != 0) {
    lVar5 = -8;
    do {
      lVar1 = lVar2 * -8 + lVar5;
      if (lVar1 == -8) goto LAB_0060f7cf;
      in_RCX = lVar5 + 8;
      lVar4 = lVar5 + 8;
      lVar5 = in_RCX;
    } while (*(QGraphicsItem **)((long)(this->mouseGrabberItems).d.ptr + lVar4) != item);
    in_RCX = in_RCX >> 3;
LAB_0060f7cf:
    if (lVar1 != -8) goto LAB_0060f7dc;
  }
  in_RCX = -1;
LAB_0060f7dc:
  if (in_RCX == -1) {
    if (lVar2 != 0) {
      this_00 = (this->mouseGrabberItems).d.ptr[lVar2 + -1];
      if ((this->field_0xb9 & 8) == 0) {
        local_48 = (QGraphicsItem *)&DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        QEvent::QEvent((QEvent *)&local_48,UngrabMouse);
        sendEvent(this,this_00,(QEvent *)&local_48);
        QEvent::~QEvent((QEvent *)&local_48);
      }
      else {
        QGraphicsItem::ungrabMouse(this_00);
      }
    }
    local_48 = item;
    QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
              ((QPodArrayOps<QGraphicsItem*> *)&this->mouseGrabberItems,
               (this->mouseGrabberItems).d.size,&local_48);
    QList<QGraphicsItem_*>::end(&this->mouseGrabberItems);
    *(uint *)&this->field_0xb8 = *(uint *)&this->field_0xb8 & 0xfffff7ff | (uint)implicit << 0xb;
    local_48 = (QGraphicsItem *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_48,GrabMouse);
    sendEvent(this,item,(QEvent *)&local_48);
    QEvent::~QEvent((QEvent *)&local_48);
  }
  else {
    ppQVar3 = (this->mouseGrabberItems).d.ptr;
    if (ppQVar3[lVar2 + -1] == item) {
      if ((*(uint *)&this->field_0xb8 >> 0xb & 1) == 0) {
        grabMouse();
      }
      else {
        *(uint *)&this->field_0xb8 = *(uint *)&this->field_0xb8 & 0xfffff7ff;
      }
    }
    else {
      grabMouse((QGraphicsScenePrivate *)(ppQVar3 + lVar2 + -1));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::grabMouse(QGraphicsItem *item, bool implicit)
{
    // Append to list of mouse grabber items, and send a mouse grab event.
    if (mouseGrabberItems.contains(item)) {
        if (mouseGrabberItems.constLast() == item) {
            Q_ASSERT(!implicit);
            if (!lastMouseGrabberItemHasImplicitMouseGrab) {
                qWarning("QGraphicsItem::grabMouse: already a mouse grabber");
            } else {
                // Upgrade to an explicit mouse grab
                lastMouseGrabberItemHasImplicitMouseGrab = false;
            }
        } else {
            qWarning("QGraphicsItem::grabMouse: already blocked by mouse grabber: %p",
                     mouseGrabberItems.constLast());
        }
        return;
    }

    // Send ungrab event to the last grabber.
    if (!mouseGrabberItems.isEmpty()) {
        QGraphicsItem *last = mouseGrabberItems.constLast();
        if (lastMouseGrabberItemHasImplicitMouseGrab) {
            // Implicit mouse grab is immediately lost.
            last->ungrabMouse();
        } else {
            // Just send ungrab event to current grabber.
            QEvent ungrabEvent(QEvent::UngrabMouse);
            sendEvent(last, &ungrabEvent);
        }
    }

    mouseGrabberItems << item;
    lastMouseGrabberItemHasImplicitMouseGrab = implicit;

    // Send grab event to current grabber.
    QEvent grabEvent(QEvent::GrabMouse);
    sendEvent(item, &grabEvent);
}